

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tonk.cpp
# Opt level: O3

TonkResult tonk_send(TonkConnection connection,void *data,uint64_t bytes,uint32_t channel)

{
  TonkResult TVar1;
  Result result;
  Result local_10;
  
  if (connection == (TonkConnection)0x0) {
    TVar1 = Tonk_InvalidInput;
  }
  else {
    tonk::Connection::tonk_send
              ((Connection *)&stack0xfffffffffffffff0,(uint)connection,(uint8_t *)(ulong)channel,
               (uint64_t)data);
    if (local_10.Error == (ErrorResult *)0x0) {
      TVar1 = Tonk_Success;
    }
    else {
      switch((local_10.Error)->Type) {
      case Tonk:
        TVar1 = (TonkResult)(local_10.Error)->Code;
        break;
      case Siamese:
        TVar1 = Tonk_FECFailed;
        break;
      case Asio:
      case LastErr:
        TVar1 = Tonk_NetworkFailed;
        break;
      case Cymric:
        TVar1 = Tonk_PRNGFailed;
        break;
      default:
        TVar1 = Tonk_Error;
      }
    }
    tonk::Result::~Result(&stack0xfffffffffffffff0);
  }
  return TVar1;
}

Assistant:

TONK_EXPORT TonkResult tonk_send(
    TonkConnection      connection, // Connection to send on
    const void*               data, // Pointer to message data
    uint64_t                 bytes, // Message bytes
    uint32_t               channel  // Channel to attach to message
)
{
    Connection* tonkConnection = reinterpret_cast<Connection*>(connection);
    if (!tonkConnection)
    {
        TONK_DEBUG_BREAK(); // Invalid input
        return Tonk_InvalidInput;
    }

    Result result = tonkConnection->tonk_send(
        channel,
        reinterpret_cast<const uint8_t*>(data),
        bytes);
    return TonkResultFromDetailedResult(result);
}